

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

int GetDefaultLocaleMask(TCascStorage *hs,PQUERY_KEY pTagsString)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  TGameLocaleString *pTVar5;
  LPBYTE pBVar6;
  DWORD DVar7;
  LPBYTE __s2;
  LPBYTE pBVar8;
  
  if ((long)pTagsString->cbData < 1) {
    DVar7 = 0;
  }
  else {
    pBVar6 = pTagsString->pbData + pTagsString->cbData;
    DVar7 = 0;
    __s2 = pTagsString->pbData;
    do {
      pBVar8 = __s2 + 4;
      if ((pBVar6 < pBVar8) || ((*pBVar8 != ',' && (*pBVar8 != ' ')))) {
        pBVar8 = __s2 + 1;
      }
      else {
        iVar2 = strncmp("enUS",(char *)__s2,4);
        pTVar5 = LocaleStrings;
        if (iVar2 != 0) {
          lVar1 = 0;
          do {
            lVar4 = lVar1;
            if (lVar4 + 0x10 == 0xf0) {
              uVar3 = 0;
              goto LAB_001122ca;
            }
            iVar2 = strncmp(*(char **)((long)&LocaleStrings[1].szLocale + lVar4),(char *)__s2,4);
            lVar1 = lVar4 + 0x10;
          } while (iVar2 != 0);
          pTVar5 = (TGameLocaleString *)(lVar4 + 0x12d360);
        }
        uVar3 = pTVar5->dwLocale;
LAB_001122ca:
        DVar7 = DVar7 | uVar3;
      }
      __s2 = pBVar8;
    } while (pBVar8 < pBVar6);
  }
  hs->dwDefaultLocale = DVar7;
  return (int)hs;
}

Assistant:

static int GetDefaultLocaleMask(TCascStorage * hs, PQUERY_KEY pTagsString)
{
    char * szTagEnd = (char *)pTagsString->pbData + pTagsString->cbData;
    char * szTagPtr = (char *)pTagsString->pbData;
    DWORD dwLocaleMask = 0;

    while(szTagPtr < szTagEnd)
    {
        // Could this be a locale string?
        if((szTagPtr + 4) <= szTagEnd && (szTagPtr[4] == ',' ||  szTagPtr[4] == ' '))
        {
            // Check whether the current tag is a language identifier
            dwLocaleMask = dwLocaleMask | GetLocaleMask(szTagPtr);
            szTagPtr += 4;
        }
        else
        {
            szTagPtr++;
        }
    }

    hs->dwDefaultLocale = dwLocaleMask;
    return ERROR_SUCCESS;
}